

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_logging.c
# Opt level: O3

int oonf_log_register_source(char *name)

{
  size_t sVar1;
  int iVar2;
  size_t sVar3;
  size_t sVar4;
  char *pcVar5;
  char **ppcVar6;
  
  sVar1 = _source_count;
  if (_source_count == 0) {
    sVar4 = 0;
LAB_0014c280:
    pcVar5 = strdup(name);
    LOG_SOURCE_NAMES[sVar4] = pcVar5;
    if (pcVar5 != (char *)0x0) {
      _source_count = sVar1 + 1;
      sVar3 = strlen(name);
      if (_max_sourcetext_len < sVar3) {
        _max_sourcetext_len = sVar3;
      }
      goto LAB_0014c2fc;
    }
    sVar4 = 1;
    if ((log_global_mask[2] & 4) == 0) goto LAB_0014c2fc;
    pcVar5 = "Not enough memory for duplicating source name %s";
    iVar2 = 0xda;
  }
  else {
    ppcVar6 = LOG_SOURCE_NAMES;
    sVar4 = 0;
    do {
      iVar2 = strcmp(name,*ppcVar6);
      if (iVar2 == 0) goto LAB_0014c2fc;
      sVar4 = sVar4 + 1;
      ppcVar6 = ppcVar6 + 1;
    } while (sVar1 != sVar4);
    sVar4 = sVar1;
    if (sVar1 != 0x80) goto LAB_0014c280;
    sVar4 = 1;
    if ((log_global_mask[2] & 4) == 0) goto LAB_0014c2fc;
    pcVar5 = "Maximum number of logging sources reached, cannot allocate %s";
    iVar2 = 0xd5;
  }
  sVar4 = 1;
  oonf_log(LOG_SEVERITY_WARN,LOG_LOGGING,"src/libcore/oonf_logging.c",iVar2,(void *)0x0,0,pcVar5,
           name);
LAB_0014c2fc:
  return (int)sVar4;
}

Assistant:

int
oonf_log_register_source(const char *name) {
  size_t i, len;

  /* maybe the source is already there ? */
  for (i = 0; i < _source_count; i++) {
    if (strcmp(name, LOG_SOURCE_NAMES[i]) == 0) {
      return i;
    }
  }

  if (i == LOG_MAXIMUM_SOURCES) {
    OONF_WARN(LOG_LOGGING,
      "Maximum number of logging sources reached,"
      " cannot allocate %s",
      name);
    return LOG_MAIN;
  }

  if ((LOG_SOURCE_NAMES[i] = strdup(name)) == NULL) {
    OONF_WARN(LOG_LOGGING, "Not enough memory for duplicating source name %s", name);
    return LOG_MAIN;
  }

  _source_count++;
  len = strlen(name);
  if (len > _max_sourcetext_len) {
    _max_sourcetext_len = len;
  }
  return i;
}